

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_CreateMessageDispatchesToSpecialFunctions_Test::
~ArenaTest_CreateMessageDispatchesToSpecialFunctions_Test
          (ArenaTest_CreateMessageDispatchesToSpecialFunctions_Test *this)

{
  ArenaTest_CreateMessageDispatchesToSpecialFunctions_Test *this_local;
  
  ~ArenaTest_CreateMessageDispatchesToSpecialFunctions_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, CreateMessageDispatchesToSpecialFunctions) {
  hook_called = "";
  Arena::Create<DispatcherTestProto>(nullptr);
  EXPECT_EQ(hook_called, "default");

  DispatcherTestProto ref(absl::in_place);
  const DispatcherTestProto& cref = ref;

  hook_called = "";
  Arena::Create<DispatcherTestProto>(nullptr);
  EXPECT_EQ(hook_called, "default");

  hook_called = "";
  Arena::Create<DispatcherTestProto>(nullptr, ref);
  EXPECT_EQ(hook_called, "copy");

  hook_called = "";
  Arena::Create<DispatcherTestProto>(nullptr, cref);
  EXPECT_EQ(hook_called, "copy");

  hook_called = "";
  Arena::Create<DispatcherTestProto>(nullptr, 1);
  EXPECT_EQ(hook_called, "fallback");
}